

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,string *bytes)

{
  string_view data;
  size_t in_RSI;
  char *in_RDI;
  __sv_type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  ActionMessage *in_stack_ffffffffffffffe0;
  
  ActionMessage(in_stack_ffffffffffffffe0);
  _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffffd0);
  data._M_str = in_RDI;
  data._M_len = in_RSI;
  from_string((ActionMessage *)_Var1._M_str,data);
  return;
}

Assistant:

ActionMessage::ActionMessage(const std::string& bytes): ActionMessage()
{
    from_string(bytes);
}